

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffInfo.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ApprovalTests::DiffInfo::getProgramFileLocations_abi_cxx11_(void)

{
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  pointer ppcVar1;
  initializer_list<const_char_*> __l;
  vector<const_char_*,_std::allocator<const_char_*>_> envVars;
  string envVarValue;
  allocator_type local_61;
  vector<const_char_*,_std::allocator<const_char_*>_> local_60;
  undefined1 local_48 [32];
  
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._16_8_ = "ProgramFiles(x86)";
  local_48._0_8_ = "ProgramFiles";
  local_48._8_8_ = "ProgramW6432";
  __l._M_len = 3;
  __l._M_array = (iterator)local_48;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_60,__l,&local_61);
  if (local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    name = extraout_RDX;
    ppcVar1 = local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      SystemUtils::safeGetEnv_abi_cxx11_((string *)local_48,(SystemUtils *)*ppcVar1,name);
      name = extraout_RDX_00;
      if ((char *)local_48._8_8_ != (char *)0x0) {
        ::std::__cxx11::string::push_back((char)(string *)local_48);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_RDI,(string *)local_48);
        name = extraout_RDX_01;
      }
      if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
        operator_delete((void *)local_48._0_8_);
        name = extraout_RDX_02;
      }
      ppcVar1 = ppcVar1 + 1;
    } while (ppcVar1 !=
             local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> DiffInfo::getProgramFileLocations()
    {
        std::vector<std::string> possibleWindowsPaths;
        const std::vector<const char*> envVars = {
            "ProgramFiles", "ProgramW6432", "ProgramFiles(x86)"};

        for (const auto& envVar : envVars)
        {
            std::string envVarValue = SystemUtils::safeGetEnv(envVar);
            if (!envVarValue.empty())
            {
                envVarValue += '\\';
                possibleWindowsPaths.push_back(envVarValue);
            }
        }
        return possibleWindowsPaths;
    }